

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# position_second_step1.cpp
# Opt level: O2

bool __thiscall
ruckig::PositionSecondOrderStep1::get_profile
          (PositionSecondOrderStep1 *this,Profile *input,Block *block)

{
  array<ruckig::Profile,_3UL> *this_00;
  ulong uVar1;
  bool bVar2;
  double dVar3;
  double dVar4;
  double in_XMM2_Qa;
  double aMax;
  undefined4 in_XMM3_Da;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 in_XMM3_Db;
  undefined4 uVar7;
  ProfileIter profile;
  double local_58;
  double local_50;
  double local_48;
  undefined8 uStack_40;
  double local_38;
  undefined8 uStack_30;
  
  if ((((this->_vMax == 0.0) && (!NAN(this->_vMax))) && (this->_vMin == 0.0)) && (!NAN(this->_vMin))
     ) {
    Profile::set_boundary(&block->p_min,input);
    bVar2 = time_all_single_step
                      (this,&block->p_min,this->_vMax,this->_vMin,in_XMM2_Qa,
                       (double)CONCAT44(in_XMM3_Db,in_XMM3_Da));
    if (!bVar2) {
      return false;
    }
    dVar3 = (block->p_min).t_sum._M_elems[6] + (block->p_min).brake.duration +
            (block->p_min).accel.duration;
    block->t_min = dVar3;
    if (ABS(this->v0) <= 2.220446049250313e-16) {
      return true;
    }
    (block->a).super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
    super__Optional_payload_base<ruckig::Block::Interval>._M_payload._M_value.left = dVar3;
    (block->a).super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
    super__Optional_payload_base<ruckig::Block::Interval>._M_payload._M_value.right = INFINITY;
    (block->a).super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
    super__Optional_payload_base<ruckig::Block::Interval>._M_payload._M_value.profile.brake.duration
         = 0.0;
    (block->a).super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
    super__Optional_payload_base<ruckig::Block::Interval>._M_payload._M_value.profile.accel.duration
         = 0.0;
    if ((block->a).super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
        super__Optional_payload_base<ruckig::Block::Interval>._M_engaged != false) {
      return true;
    }
    (block->a).super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
    super__Optional_payload_base<ruckig::Block::Interval>._M_engaged = true;
    return true;
  }
  this_00 = &this->valid_profiles;
  profile = this_00->_M_elems;
  Profile::set_boundary(this_00->_M_elems,input);
  if (2.220446049250313e-16 <= ABS(this->vf)) {
    time_none(this,&profile,this->_vMax,this->_vMin,this->_aMax,this->_aMin,false);
    time_none(this,&profile,this->_vMin,this->_vMax,this->_aMin,this->_aMax,false);
    time_acc0(this,&profile,this->_vMax,this->_vMin,this->_aMax,this->_aMin,false);
    dVar3 = this->_vMax;
    dVar4 = this->_vMin;
    aMax = this->_aMin;
    uVar6 = SUB84(this->_aMax,0);
    uVar7 = (undefined4)((ulong)this->_aMax >> 0x20);
  }
  else {
    dVar3 = this->pd;
    local_38 = (double)(~-(ulong)(dVar3 < 0.0) & (ulong)this->_vMax |
                       -(ulong)(dVar3 < 0.0) & (ulong)this->_vMin);
    local_48 = this->_vMax;
    if (0.0 <= dVar3) {
      local_48 = this->_vMin;
    }
    local_50 = this->_aMin;
    uVar5 = SUB84(local_50,0);
    uVar1 = (ulong)local_50 >> 0x20;
    dVar4 = this->_aMax;
    uVar6 = SUB84(dVar4,0);
    uVar7 = (undefined4)((ulong)dVar4 >> 0x20);
    if (0.0 <= dVar3) {
      local_50 = dVar4;
      uVar6 = uVar5;
      uVar7 = (int)uVar1;
    }
    uStack_30 = 0;
    uStack_40 = 0;
    local_58 = (double)CONCAT44(uVar7,uVar6);
    time_none(this,&profile,local_38,local_48,local_50,(double)CONCAT44(uVar7,uVar6),true);
    if (((this_00 < profile) ||
        (time_acc0(this,&profile,local_38,local_48,local_50,local_58,false), this_00 < profile)) ||
       (time_none(this,&profile,local_48,local_38,local_58,local_50,true), this_00 < profile))
    goto LAB_0015f7a0;
    uVar6 = SUB84(local_50,0);
    uVar7 = (undefined4)((ulong)local_50 >> 0x20);
    dVar3 = local_38;
    aMax = local_58;
    dVar4 = local_48;
  }
  time_acc0(this,&profile,dVar4,dVar3,aMax,(double)CONCAT44(uVar7,uVar6),false);
LAB_0015f7a0:
  bVar2 = Block::calculate_block<3ul,true>(block,this_00,((long)profile - (long)this_00) / 0x240);
  return bVar2;
}

Assistant:

bool PositionSecondOrderStep1::get_profile(const Profile& input, Block& block) {
    // Zero-limits special case
    if (_vMax == 0.0 && _vMin == 0.0) {
        auto& p = block.p_min;
        p.set_boundary(input);

        if (time_all_single_step(&p, _vMax, _vMin, _aMax, _aMin)) {
            block.t_min = p.t_sum.back() + p.brake.duration + p.accel.duration;
            if (std::abs(v0) > DBL_EPSILON) {
                block.a = Block::Interval(block.t_min, std::numeric_limits<double>::infinity());
            }
            return true;
        }
        return false;
    }

    const ProfileIter start = valid_profiles.begin();
    ProfileIter profile = start;
    profile->set_boundary(input);

    if (std::abs(vf) < DBL_EPSILON) {
        // There is no blocked interval when vf==0, so return after first found profile
        const double vMax = (pd >= 0) ? _vMax : _vMin;
        const double vMin = (pd >= 0) ? _vMin : _vMax;
        const double aMax = (pd >= 0) ? _aMax : _aMin;
        const double aMin = (pd >= 0) ? _aMin : _aMax;

        time_none(profile, vMax, vMin, aMax, aMin, true);
        if (profile > start) { goto return_block; }
        time_acc0(profile, vMax, vMin, aMax, aMin, true);
        if (profile > start) { goto return_block; }

        time_none(profile, vMin, vMax, aMin, aMax, true);
        if (profile > start) { goto return_block; }
        time_acc0(profile, vMin, vMax, aMin, aMax, true);

    } else {
        time_none(profile, _vMax, _vMin, _aMax, _aMin, false);
        time_none(profile, _vMin, _vMax, _aMin, _aMax, false);
        time_acc0(profile, _vMax, _vMin, _aMax, _aMin, false);
        time_acc0(profile, _vMin, _vMax, _aMin, _aMax, false);
    }

return_block:
    return Block::calculate_block(block, valid_profiles, std::distance(start, profile));
}